

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmMove8<(moira::Instr)71,(moira::Mode)8,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char *pcVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  StrWriter *this_00;
  char *pcVar6;
  char cVar7;
  Ea<(moira::Mode)8,_(moira::Size)2> dst;
  Ea<(moira::Mode)8,_(moira::Size)2> src;
  Ea<(moira::Mode)8,_(moira::Size)2> local_50;
  Ea<(moira::Mode)8,_(moira::Size)2> local_3c;
  
  local_3c.reg = op & 7;
  local_3c.pc = *addr;
  *addr = local_3c.pc + 2;
  iVar4 = (*this->_vptr_Moira[5])();
  *addr = *addr + 2;
  uVar5 = (*this->_vptr_Moira[5])(this);
  local_3c.ext1 = uVar5 & 0xffff | iVar4 << 0x10;
  local_50.reg = op >> 9 & 7;
  local_50.pc = *addr;
  *addr = local_50.pc + 2;
  iVar4 = (*this->_vptr_Moira[5])(this);
  *addr = *addr + 2;
  uVar5 = (*this->_vptr_Moira[5])(this);
  local_50.ext1 = uVar5 & 0xffff | iVar4 << 0x10;
  bVar3 = str->upper;
  pcVar6 = "move";
  if ((bool)bVar3 != false) {
    pcVar6 = "MOVE";
  }
  cVar7 = *pcVar6;
  if (cVar7 != '\0') {
    do {
      pcVar6 = pcVar6 + 1;
      pcVar1 = str->ptr;
      str->ptr = pcVar1 + 1;
      *pcVar1 = cVar7;
      cVar7 = *pcVar6;
    } while (cVar7 != '\0');
    bVar3 = str->upper;
  }
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = '.';
  pbVar2 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar2 + 1);
  *pbVar2 = (~bVar3 & 1) << 5 | 0x57;
  iVar4 = (this->tab).raw;
  while (pcVar6 = str->ptr, pcVar6 < str->base + iVar4) {
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  this_00 = StrWriter::operator<<(str,&local_3c);
  pcVar6 = this_00->ptr;
  this_00->ptr = pcVar6 + 1;
  *pcVar6 = ',';
  pcVar6 = this_00->ptr;
  this_00->ptr = pcVar6 + 1;
  *pcVar6 = ' ';
  StrWriter::operator<<(this_00,&local_50);
  return;
}

Assistant:

void
Moira::dasmMove8(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <MODE_AL,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}